

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YuvImageProcessor.cpp
# Opt level: O1

void MMXProcessor(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  char (*pacVar4) [1920];
  long lVar5;
  int num;
  long lVar6;
  void *pvVar7;
  long lVar8;
  int i;
  ulong uVar9;
  long lVar10;
  char cVar11;
  int j;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  undefined8 uVar19;
  int iVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM6 [16];
  int iVar12;
  
  uVar9 = 0xffffffffffffffff;
  if (-1 < (long)size) {
    uVar9 = (long)size * 8;
  }
  pvVar3 = operator_new__(uVar9);
  auVar2 = _DAT_00103200;
  pacVar4 = y;
  uVar9 = 0;
  pvVar7 = pvVar3;
  do {
    uVar14 = uVar9 >> 1 & 0x7fffffff;
    uVar13 = 0;
    do {
      uVar18 = uVar13 >> 1 & 0x7fffffff;
      uVar21 = (ulong)CONCAT24((byte)v[uVar14][uVar18] - 0x80,
                               CONCAT22((byte)u[uVar14][uVar18] - 0x80,
                                        (byte)(*pacVar4)[uVar13] - 0x10));
      uVar18 = pmaddwd(uVar21,0x1990000012a);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar18;
      uVar18 = pmaddwd(uVar21,0xff30ff9c012a);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar18;
      uVar22 = pmaddwd(uVar21,0x204012a);
      auVar1 = vpunpcklqdq_avx(auVar26,auVar28);
      auVar1 = vpshufb_avx(auVar1,auVar2);
      auVar26 = vpunpckldq_avx(auVar26,auVar28);
      auVar1 = vpaddd_avx(auVar26,auVar1);
      uVar19 = movdq2q(uVar18,auVar1);
      uVar17 = (int)uVar19 + 0x80 >> 8;
      iVar20 = (int)((ulong)uVar19 >> 0x20) + 0x80 >> 8;
      if (0xfe < (int)uVar17) {
        uVar17 = 0xff;
      }
      iVar24 = iVar20;
      if (0xff < iVar20) {
        iVar24 = 0xff;
      }
      if (iVar20 < 0) {
        iVar24 = 0;
      }
      uVar16 = (int)uVar22 + 0x80 + (int)((ulong)uVar22 >> 0x20) >> 8;
      if (0xfe < (int)uVar16) {
        uVar16 = 0xff;
      }
      auVar1 = vpinsrw_avx(ZEXT416(~((int)uVar17 >> 0x1f) & uVar17 & 0xffff),iVar24,1);
      auVar1 = vpinsrw_avx(auVar1,~((int)uVar16 >> 0x1f) & uVar16,2);
      *(long *)((long)pvVar7 + uVar13 * 8) = auVar1._0_8_;
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x780);
    uVar9 = uVar9 + 1;
    pvVar7 = (void *)((long)pvVar7 + 0x3c00);
    pacVar4 = pacVar4 + 1;
  } while (uVar9 != 0x438);
  uVar19 = 0x1900810042;
  lVar6 = 0;
  do {
    uVar9 = lVar6 * 3 + 1U & 0xffffffff;
    uVar22 = pshufw(uVar9,uVar9,0);
    lVar8 = 0;
    uVar9 = 0;
    do {
      uVar14 = 0;
      lVar5 = lVar8;
      do {
        uVar23 = *(undefined8 *)((long)pvVar3 + lVar5 * 8);
        uVar23 = CONCAT26((ushort)((short)((ulong)uVar23 >> 0x30) * (short)((ulong)uVar22 >> 0x30))
                          >> 8,CONCAT24((ushort)((short)((ulong)uVar23 >> 0x20) *
                                                (short)((ulong)uVar22 >> 0x20)) >> 8,
                                        CONCAT22((ushort)((short)((ulong)uVar23 >> 0x10) *
                                                         (short)((ulong)uVar22 >> 0x10)) >> 8,
                                                 (ushort)((short)uVar23 * (short)uVar22) >> 8)));
        uVar13 = pmaddwd(uVar23,uVar19);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar13;
        uVar13 = pmaddwd(uVar23,0x70ffb6ffda);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar13;
        uVar23 = pmaddwd(uVar23,0xffeeffa20070);
        auVar1 = vpunpcklqdq_avx(auVar27,auVar29);
        auVar1 = vpshufb_avx(auVar1,auVar2);
        auVar26 = vpunpckldq_avx(auVar27,auVar29);
        vpaddd_avx(auVar26,auVar1);
        uVar19 = movdq2q(uVar19,in_XMM6);
        iVar24 = (int)((ulong)uVar23 >> 0x20);
        iVar20 = ((int)uVar23 + 0x80 >> 8) + 0x10;
        iVar25 = (iVar24 + 0x80 >> 8) + 0x80;
        if (0xfe < iVar20) {
          iVar20 = 0xff;
        }
        iVar12 = iVar25;
        if (0xff < iVar25) {
          iVar12 = 0xff;
        }
        cVar11 = (char)iVar12;
        if (iVar25 < 0) {
          cVar11 = '\0';
        }
        iVar25 = (int)uVar23 + 0x80 + iVar24 >> 8;
        iVar24 = 0x7f;
        if (iVar25 < 0x7f) {
          iVar24 = iVar25;
        }
        cVar15 = (char)iVar24 + -0x80;
        if (iVar25 < -0x80) {
          cVar15 = '\0';
        }
        result[lVar6][0][lVar5] = ~(byte)(iVar20 >> 0x1f) & (byte)iVar20;
        lVar10 = (uVar14 >> 1 & 0x7fffffff) + (ulong)(((uint)(uVar9 >> 1) & 0x7fffffff) * 0x3c0);
        result[lVar6][1][lVar10] = cVar11;
        result[lVar6][2][lVar10] = cVar15;
        uVar14 = uVar14 + 1;
        lVar5 = lVar5 + 1;
      } while (uVar14 != 0x780);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x780;
    } while (uVar9 != 0x438);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x55);
  operator_delete__(pvVar3);
  return;
}

Assistant:

void MMXProcessor() {
    auto *data = new __m64[size];
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            auto yi = (uint8_t) y[i][j];
            auto ui = (uint8_t) u[i / 2][j / 2];
            auto vi = (uint8_t) v[i / 2][j / 2];
            __m64 yuv = _mm_setr_pi16(16, 128, 128, 0);
            yuv = _mm_sub_pi16(_mm_setr_pi16(yi, ui, vi, 0), yuv);
            __m64 r = _mm_madd_pi16(yuv, _mm_setr_pi16(298, 0, 409, 0));
            __m64 g = _mm_madd_pi16(yuv, _mm_setr_pi16(298, -100, -208, 0));
            __m64 b = _mm_madd_pi16(yuv, _mm_setr_pi16(298, 516, 0, 0));
            int rr = (_mm_cvtsi64_si32(r) + int(_mm_cvtm64_si64(r) >> 32));
            int gg = (_mm_cvtsi64_si32(g) + int(_mm_cvtm64_si64(g) >> 32));
            int bb = (_mm_cvtsi64_si32(b) + int(_mm_cvtm64_si64(b) >> 32));
            __m64 val = _mm_setr_pi32(rr, gg);
            val = _mm_add_pi32(val, _mm_setr_pi32(128, 128));
            val = _mm_srai_pi32(val, 8);
            int ri = between(_mm_cvtsi64_si32(val));
            int gi = between(int(_mm_cvtm64_si64(val)>>32));
            int bi = between((bb + 128) >> 8);
            data[i * width + j] = _mm_setr_pi16(ri, gi, bi, 0);
        }
    }
    for (int num = 0; num < frame_num; num++) {
        int a = num * 3 + 1;
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                int offset = i * width + j;
                __m64 rgb = _mm_srli_pi16(_mm_mullo_pi16(data[offset], _mm_set1_pi16(a)), 8);
                __m64 yi = (_mm_madd_pi16(rgb, _mm_setr_pi16(66, 129, 25, 0)));
                __m64 ui = (_mm_madd_pi16(rgb, _mm_setr_pi16(-38, -74, 112, 0)));
                __m64 vi = (_mm_madd_pi16(rgb, _mm_setr_pi16(112, -94, -18, 0)));
                int yy = (_mm_cvtsi64_si32(yi) + int(_mm_cvtm64_si64(yi) >> 32));
                int uu = (_mm_cvtsi64_si32(ui) + int(_mm_cvtm64_si64(ui) >> 32));
                int vv = (_mm_cvtsi64_si32(vi) + int(_mm_cvtm64_si64(vi) >> 32));
                __m64 val = _mm_setr_pi32(yy, uu);
                val = _mm_add_pi32(val, _mm_setr_pi32(128, 128));
                val = _mm_srai_pi32(val, 8);
                val = _mm_add_pi32(val, _mm_setr_pi32(16, 128));
                int ri = between(_mm_cvtsi64_si32(val));
                int gi = between(int(_mm_cvtm64_si64(val)>>32));
                int bi = between(((vv + 128) >> 8) + 128);
                result[num][0][offset] = ri;
                result[num][1][(i / 2) * (width / 2) + j / 2] = gi;
                result[num][2][(i / 2) * (width / 2) + j / 2] = bi;
            }
        }
    }
    delete[] data;
}